

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O0

char * strpool_internal_get_data_storage(strpool_t *pool,int size,int *alloc_size)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint local_6c;
  char *data;
  char *data_1;
  int offset;
  strpool_internal_free_block_t *prev_entry;
  strpool_internal_free_block_t *free_entry;
  int local_30;
  int prev_list;
  int free_list;
  int i;
  int *alloc_size_local;
  int size_local;
  strpool_t *pool_local;
  
  alloc_size_local._4_4_ = size;
  if ((uint)size < 8) {
    alloc_size_local._4_4_ = 8;
  }
  if ((int)alloc_size_local._4_4_ < pool->min_data_size) {
    alloc_size_local._4_4_ = pool->min_data_size;
  }
  uVar1 = strpool_internal_pow2ceil(alloc_size_local._4_4_);
  prev_list = 0;
  do {
    if (pool->block_count <= prev_list) {
      if (pool->blocks[pool->current_block].capacity -
          ((int)pool->blocks[pool->current_block].tail - (int)pool->blocks[pool->current_block].data
          ) < (int)uVar1) {
        local_6c = uVar1;
        if ((int)uVar1 <= pool->block_size) {
          local_6c = pool->block_size;
        }
        iVar2 = strpool_internal_add_block(pool,local_6c);
        pool->current_block = iVar2;
        pool_local = (strpool_t *)pool->blocks[pool->current_block].tail;
        pool->blocks[pool->current_block].tail = pool->blocks[pool->current_block].tail + (int)uVar1
        ;
        *alloc_size = uVar1;
      }
      else {
        pool_local = (strpool_t *)pool->blocks[pool->current_block].tail;
        pool->blocks[pool->current_block].tail = pool->blocks[pool->current_block].tail + (int)uVar1
        ;
        *alloc_size = uVar1;
      }
      return (char *)pool_local;
    }
    local_30 = pool->blocks[prev_list].free_list;
    free_entry._4_4_ = -1;
    while (-1 < local_30) {
      piVar3 = (int *)(pool->blocks[prev_list].data + local_30);
      if (*piVar3 / 2 < (int)uVar1) {
        if ((int)uVar1 <= *piVar3) {
          if (free_entry._4_4_ < 0) {
            pool->blocks[prev_list].free_list = piVar3[1];
          }
          else {
            *(int *)(pool->blocks[prev_list].data + (long)free_entry._4_4_ + 4) = piVar3[1];
          }
          *alloc_size = *piVar3;
          return (char *)piVar3;
        }
        break;
      }
      free_entry._4_4_ = local_30;
      local_30 = piVar3[1];
    }
    prev_list = prev_list + 1;
  } while( true );
}

Assistant:

static char* strpool_internal_get_data_storage( strpool_t* pool, int size, int* alloc_size )
    {
    if( size < sizeof( strpool_internal_free_block_t ) ) size = sizeof( strpool_internal_free_block_t );
    if( size < pool->min_data_size ) size = pool->min_data_size;
    size = (int)strpool_internal_pow2ceil( (STRPOOL_U32)size );
    
    // Try to find a large enough free slot in existing blocks
    for( int i = 0; i < pool->block_count; ++i )
        {
        int free_list = pool->blocks[ i ].free_list;
        int prev_list = -1;
        while( free_list >= 0 )
            {
            strpool_internal_free_block_t* free_entry = 
                (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + free_list );
            if( free_entry->size / 2 < size ) 
                {
                // At this point, all remaining slots are too small, so bail out if the current slot is not large enough
                if( free_entry->size < size ) break; 

                if( prev_list < 0 )
                    {
                    pool->blocks[ i ].free_list = free_entry->next;         
                    }
                else
                    {
                    strpool_internal_free_block_t* prev_entry = 
                        (strpool_internal_free_block_t*) ( pool->blocks[ i ].data + prev_list );
                    prev_entry->next = free_entry->next;
                    }
                *alloc_size = free_entry->size;
                return (char*) free_entry;
                }
            prev_list = free_list;
            free_list = free_entry->next;
            }
        }

    // Use current block, if enough space left
    int offset = (int) ( pool->blocks[ pool->current_block ].tail - pool->blocks[ pool->current_block ].data );
    if( size <= pool->blocks[ pool->current_block ].capacity - offset )
        {
        char* data = pool->blocks[ pool->current_block ].tail;
        pool->blocks[ pool->current_block ].tail += size;
        *alloc_size = size;
        return data;
        }

    // Allocate a new block
    pool->current_block = strpool_internal_add_block( pool, size > pool->block_size ? size : pool->block_size );
    char* data = pool->blocks[ pool->current_block ].tail;
    pool->blocks[ pool->current_block ].tail += size;
    *alloc_size = size;
    return data;
    }